

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QTreeWidgetItem *after,int type)

{
  QTreeWidgetItemPrivate *pQVar1;
  QTreeModel *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QTreeWidgetItem *after_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_007ea768;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  after_local = after;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  *(undefined8 *)((long)&(pQVar1->display).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(pQVar1->display).d.size + 1) = 0;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  pQVar2 = treeModel(this,treeview);
  if (pQVar2 != (QTreeModel *)0x0) {
    qVar3 = QtPrivate::indexOf<QTreeWidgetItem*,QTreeWidgetItem*>
                      (&pQVar2->rootItem->children,&after_local,0);
    insertChild(pQVar2->rootItem,(int)qVar3 + 1,this);
    QList<QList<QWidgetItemData>_>::reserve
              (&this->values,(long)(int)(pQVar2->headerItem->values).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, QTreeWidgetItem *after, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        int i = model->rootItem->children.indexOf(after) + 1;
        model->rootItem->insertChild(i, this);
        values.reserve(model->headerItem->columnCount());
    }
}